

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkSIprefix(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char p;
  int iVar4;
  ulong uVar5;
  precise_unit pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  double local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar5 = unit_string->_M_string_length;
  if (2 < uVar5) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    cVar1 = pcVar2[1];
    bVar3 = true;
    if (cVar1 == 'A') goto LAB_003a8d51;
    local_c0 = getPrefixMultiplier2Char(*pcVar2,cVar1);
    if ((local_c0 == 0.0) && (!NAN(local_c0))) goto LAB_003a8d4f;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
               0xffffffffffffffff);
    if (local_b0._M_string_length != 1) {
LAB_003a8cb0:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      pVar6 = unit_quick_match(&local_50,match_flags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((pVar6._8_8_ & 0xffffffff) == 0xfa94a488 && NAN(pVar6.multiplier_)) {
        uVar5 = unit_string->_M_string_length;
        goto LAB_003a8d45;
      }
      goto LAB_003a90e3;
    }
    cVar1 = *local_b0._M_dataplus._M_p;
    if (cVar1 == 'k') goto LAB_003a90f2;
    if (cVar1 != 'b') {
      if (cVar1 != 'B') goto LAB_003a8cb0;
      goto LAB_003a8f08;
    }
    goto LAB_003a8f1c;
  }
LAB_003a8d45:
  if (uVar5 < 2) goto LAB_003a90b5;
LAB_003a8d4f:
  bVar3 = false;
LAB_003a8d51:
  cVar1 = *(unit_string->_M_dataplus)._M_p;
  p = 'n';
  if (cVar1 != 'N') {
    p = cVar1;
  }
  if (((uint)match_flags >> 9 & 1) == 0) {
    p = cVar1;
  }
  if (((uint)match_flags >> 8 & 1) == 0) {
    local_c0 = getPrefixMultiplier(p);
    if ((local_c0 != 0.0) || (NAN(local_c0))) goto LAB_003a8ec7;
    goto switchD_003a8db1_caseD_46;
  }
  switch(p) {
  case 'E':
    local_c0 = 1e+18;
    break;
  case 'F':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'N':
  case 'O':
  case 'S':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'b':
  case 'e':
  case 'g':
  case 'i':
  case 'j':
  case 'l':
  case 'o':
  case 's':
  case 't':
  case 'v':
  case 'w':
  case 'x':
    goto switchD_003a8db1_caseD_46;
  case 'G':
    local_c0 = 1000000000.0;
    break;
  case 'M':
    local_c0 = 1000000.0;
    break;
  case 'P':
    local_c0 = 1e+15;
    break;
  case 'Q':
    local_c0 = 1e+30;
    break;
  case 'R':
    local_c0 = 1e+27;
    break;
  case 'T':
    local_c0 = 1000000000000.0;
    break;
  case 'Y':
    local_c0 = 1e+24;
    break;
  case 'Z':
    local_c0 = 1e+21;
    break;
  case 'a':
    local_c0 = 1e-18;
    break;
  case 'c':
    local_c0 = 0.01;
    break;
  case 'd':
    local_c0 = 0.1;
    break;
  case 'f':
    local_c0 = 1e-15;
    break;
  case 'h':
    local_c0 = 100.0;
    break;
  case 'k':
    local_c0 = 1000.0;
    break;
  case 'm':
    local_c0 = 0.001;
    break;
  case 'n':
    local_c0 = 1e-09;
    break;
  case 'p':
    local_c0 = 1e-12;
    break;
  case 'q':
    local_c0 = 1e-30;
    break;
  case 'r':
    local_c0 = 1e-27;
    break;
  case 'u':
switchD_003a8db1_caseD_75:
    local_c0 = 1e-06;
    break;
  case 'y':
    local_c0 = 1e-24;
    break;
  case 'z':
    local_c0 = 1e-21;
    break;
  default:
    if (p == -0x4b) goto switchD_003a8db1_caseD_75;
    goto switchD_003a8db1_caseD_46;
  }
LAB_003a8ec7:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
             0xffffffffffffffff);
  if (local_b0._M_string_length == 1) {
    cVar1 = *local_b0._M_dataplus._M_p;
    if (cVar1 == 'k') {
LAB_003a90f2:
      local_c0 = NAN;
      uVar5 = 0xfa94a488;
    }
    else {
      if (cVar1 != 'b') {
        if (cVar1 != 'B') goto LAB_003a8f26;
LAB_003a8f08:
        local_c0 = local_c0 * 8.0;
      }
LAB_003a8f1c:
      uVar5 = 0x4000000;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    goto LAB_003a9159;
  }
LAB_003a8f26:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  pVar6 = unit_quick_match(&local_70,match_flags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((pVar6._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar6.multiplier_)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
LAB_003a90e3:
    uVar5 = pVar6._8_8_;
    local_c0 = local_c0 * pVar6.multiplier_;
    goto LAB_003a9159;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
switchD_003a8db1_caseD_46:
  if (bVar3) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    local_c0 = getPrefixMultiplier2Char(*pcVar2,pcVar2[1]);
    if ((local_c0 != 0.0) || (NAN(local_c0))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
                 0xffffffffffffffff);
      iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_b0,"B");
      if (iVar4 == 0) {
        local_c0 = local_c0 * 8.0;
      }
      else {
        iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_b0,"b");
        if (iVar4 != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_b0._M_dataplus._M_p,
                     local_b0._M_dataplus._M_p + local_b0._M_string_length);
          pVar6 = unit_quick_match(&local_90,match_flags);
          uVar5 = pVar6._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((uVar5 & 0xffffffff) != 0xfa94a488 || !NAN(pVar6.multiplier_)) {
            local_c0 = local_c0 * pVar6.multiplier_;
            goto LAB_003a9159;
          }
          goto LAB_003a90b5;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      uVar5 = 0x4000000;
      goto LAB_003a9159;
    }
  }
LAB_003a90b5:
  local_c0 = NAN;
  uVar5 = 0xfa94a488;
LAB_003a9159:
  pVar6.base_units_ = (unit_data)(int)uVar5;
  pVar6.commodity_ = (int)(uVar5 >> 0x20);
  pVar6.multiplier_ = local_c0;
  return pVar6;
}

Assistant:

static precise_unit
    checkSIprefix(const std::string& unit_string, std::uint64_t match_flags)
{
    bool threeAgain{false};
    if (unit_string.size() >= 3) {
        if (unit_string[1] == 'A') {
            threeAgain = true;
        } else {
            auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
            if (mux != 0.0) {
                auto ustring = unit_string.substr(2);
                if (ustring.size() == 1) {
                    switch (ustring.front()) {
                        case 'B':
                            return {mux, precise::data::byte};
                        case 'b':
                            return {mux, precise::data::bit};
                        case 'k':
                            return precise::invalid;
                        default:
                            break;
                    }
                }

                auto retunit = unit_quick_match(ustring, match_flags);
                if (is_valid(retunit)) {
                    return {mux, retunit};
                }
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto c = unit_string.front();
        if (c == 'N' && ((match_flags & case_insensitive) != 0)) {
            c = 'n';
        }
        auto mux = ((match_flags & strict_si) == 0) ?
            getPrefixMultiplier(c) :
            getStrictSIPrefixMultiplier(c);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(1);
            if (ustring.size() == 1) {
                switch (ustring.front()) {
                    case 'B':
                        return {mux, precise::data::byte};
                    case 'b':
                        return {mux, precise::data::bit};
                    case 'k':
                        return precise::invalid;
                    default:
                        break;
                }
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return {mux, retunit};
            }
        }
    }
    if (threeAgain) {
        auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(2);
            if (ustring == "B") {
                return {mux, precise::data::byte};
            }
            if (ustring == "b") {
                return {mux, precise::data::bit};
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (is_valid(retunit)) {
                return {mux, retunit};
            }
        }
    }
    return precise::invalid;
}